

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O1

bool __thiscall
cmCTestTestHandler::SetTestsProperties
          (cmCTestTestHandler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  string *val;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  string *psVar2;
  size_t __n;
  pointer __s1;
  size_type sVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  cmCTest *this_00;
  double dVar5;
  pointer pbVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  element_type *peVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  long lVar14;
  mapped_type *pmVar15;
  ostream *poVar16;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  ulong uVar17;
  size_type __rlen;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  string *cr;
  pointer pcVar19;
  pointer pbVar20;
  pointer __x;
  bool bVar21;
  string_view arg;
  string_view arg_00;
  string_view value;
  string_view value_00;
  string_view arg_01;
  string_view arg_02;
  string_view arg_03;
  string_view arg_04;
  string_view value_01;
  string_view arg_05;
  string_view value_02;
  string_view arg_06;
  string_view arg_07;
  string_view arg_08;
  string_view arg_09;
  string_view arg_10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propArgs;
  long line;
  string mVal;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lval;
  int local_454;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_448;
  size_type local_430;
  undefined1 local_428 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  size_type local_3e8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_3e0;
  bool local_3c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_3b8;
  cmCTestTestHandler *local_3b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a8;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_388;
  pointer local_378;
  pointer local_370;
  cmListFileContext local_368;
  undefined1 local_2f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8 [6];
  ios_base local_288 [600];
  
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __x = (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  local_3b8 = args;
  local_3b0 = this;
  if (__x != (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      iVar12 = std::__cxx11::string::compare((char *)__x);
      if (iVar12 == 0) goto LAB_00171633;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_3a8,__x);
      __x = __x + 1;
    } while (__x != (local_3b8->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish);
  }
  goto LAB_001724ac;
LAB_00172460:
  if (!bVar21) goto LAB_0017247f;
  pbVar20 = pbVar20 + 1;
  if (pbVar20 == local_378) goto LAB_00172477;
  goto LAB_00171684;
LAB_00171633:
  do {
    psVar2 = (local_3b8->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (__x + 1 == psVar2) {
      bVar21 = true;
      goto LAB_001724ae;
    }
    val = __x + 2;
    if (val == psVar2) {
      local_454 = 5;
    }
    else {
      local_378 = local_3a8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      pbVar20 = local_3a8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_3a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_3a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00171684:
        pcVar19 = (local_3b0->TestList).
                  super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_370 = (local_3b0->TestList).
                    super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        local_454 = 0;
        bVar21 = pcVar19 == local_370;
LAB_001716ad:
        if (bVar21) goto LAB_00172460;
        __n = pbVar20->_M_string_length;
        if ((__n != (pcVar19->Name)._M_string_length) ||
           ((__n != 0 &&
            (iVar12 = bcmp((pbVar20->_M_dataplus)._M_p,(pcVar19->Name)._M_dataplus._M_p,__n),
            iVar12 != 0)))) goto LAB_0017234c;
        __s1 = __x[1]._M_dataplus._M_p;
        sVar3 = __x[1]._M_string_length;
        if ((sVar3 == 0x12) && (iVar12 = bcmp(__s1,"_BACKTRACE_TRIPLES",0x12), iVar12 == 0)) {
          local_448.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_448.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_448.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          arg_09._M_str = __x[2]._M_dataplus._M_p;
          arg_09._M_len = __x[2]._M_string_length;
          cmExpandList(arg_09,&local_448,true);
          if ((ulong)(((long)local_448.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_448.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555)
              < 0x5555555555555556) {
            cmState::cmState((cmState *)local_2f8,Unknown,Normal);
            local_428._0_8_ = (element_type *)0x0;
            local_428._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                      ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_428);
            uVar8 = local_428._8_8_;
            uVar7 = local_428._0_8_;
            local_428._0_8_ = (element_type *)0x0;
            local_428._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var4 = (pcVar19->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                     .TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (pcVar19->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
            .
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)uVar7;
            (pcVar19->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
            .
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
            if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._8_8_);
            }
            uVar17 = (long)local_448.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_448.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5;
            if (2 < uVar17) {
              lVar14 = uVar17 << 5;
              do {
                local_428._0_8_ = local_428 + 0x10;
                local_428._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_428[0x10] = '\0';
                local_408._M_allocated_capacity = (size_type)&local_3f8;
                local_408._8_8_ = 0;
                local_3f8._M_local_buf[0] = '\0';
                local_3e8 = 0;
                local_3c0 = false;
                std::__cxx11::string::_M_assign((string *)local_408._M_local_buf);
                local_430 = 0;
                bVar21 = cmStrToLong((string *)
                                     ((long)&local_448.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[-2].
                                             _M_dataplus._M_p + lVar14),(long *)&local_430);
                if (!bVar21) {
                  local_430 = 0;
                }
                local_3e8 = local_430;
                std::__cxx11::string::_M_assign((string *)local_428);
                cmListFileContext::cmListFileContext(&local_368,(cmListFileContext *)local_428);
                cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
                          (&local_388,(cmListFileContext *)&pcVar19->Backtrace);
                _Var10._M_pi = local_388.TopEntry.
                               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi;
                peVar9 = local_388.TopEntry.
                         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr;
                local_388.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)0x0;
                local_388.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var4 = (pcVar19->Backtrace).
                         super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (pcVar19->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = peVar9;
                (pcVar19->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = _Var10._M_pi;
                if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
                }
                if (local_388.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_388.TopEntry.
                             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
                if ((local_368.DeferId.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_engaged == true) &&
                   (local_368.DeferId.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_engaged = false,
                   local_368.DeferId.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._M_value._M_dataplus._M_p !=
                   ((pointer)
                   ((long)&local_368.DeferId.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   + 0x10U))._M_p)) {
                  operator_delete((void *)local_368.DeferId.
                                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ._M_payload._M_value._M_dataplus._M_p,
                                  local_368.DeferId.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_368.FilePath._M_dataplus._M_p != &local_368.FilePath.field_2) {
                  operator_delete(local_368.FilePath._M_dataplus._M_p,
                                  local_368.FilePath.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_368.Name._M_dataplus._M_p != &local_368.Name.field_2) {
                  operator_delete(local_368.Name._M_dataplus._M_p,
                                  local_368.Name.field_2._M_allocated_capacity + 1);
                }
                if ((local_3c0 == true) &&
                   (local_3c0 = false,
                   local_3e0._M_value._M_dataplus._M_p !=
                   (_Alloc_hider)((long)&local_3e0._M_value + 0x10))) {
                  operator_delete((void *)local_3e0._M_value._M_dataplus._M_p,
                                  local_3e0._M_value.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_408._M_allocated_capacity != &local_3f8) {
                  operator_delete((void *)local_408._M_allocated_capacity,
                                  CONCAT71(local_3f8._M_allocated_capacity._1_7_,
                                           local_3f8._M_local_buf[0]) + 1);
                }
                if ((element_type *)local_428._0_8_ != (element_type *)(local_428 + 0x10)) {
                  operator_delete((void *)local_428._0_8_,
                                  CONCAT71(local_428._17_7_,local_428[0x10]) + 1);
                }
                uVar17 = uVar17 - 3;
                lVar14 = lVar14 + -0x60;
              } while (2 < uVar17);
            }
            cmState::~cmState((cmState *)local_2f8);
          }
LAB_00171dea:
          this_01 = &local_448;
LAB_00172347:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(this_01);
        }
        else if (sVar3 == 8) {
          iVar12 = bcmp(__s1,"DISABLED",8);
          if (iVar12 != 0) goto LAB_00171750;
          value._M_str = extraout_RDX_00;
          value._M_len = (size_t)__x[2]._M_dataplus._M_p;
          bVar21 = cmValue::IsOn((cmValue *)__x[2]._M_string_length,value);
          pcVar19->Disabled = bVar21;
        }
        else if ((sVar3 == 9) && (iVar12 = bcmp(__s1,"WILL_FAIL",9), iVar12 == 0)) {
          value_00._M_str = extraout_RDX;
          value_00._M_len = (size_t)__x[2]._M_dataplus._M_p;
          bVar21 = cmValue::IsOn((cmValue *)__x[2]._M_string_length,value_00);
          pcVar19->WillFail = bVar21;
        }
        else {
LAB_00171750:
          if ((sVar3 != 0xe) || (iVar12 = bcmp(__s1,"ATTACHED_FILES",0xe), iVar12 != 0)) {
            if (sVar3 == 0xd) {
              iVar12 = bcmp(__s1,"RESOURCE_LOCK",0xd);
              if (iVar12 != 0) goto LAB_001717b6;
              arg_01._M_str = __x[2]._M_dataplus._M_p;
              arg_01._M_len = __x[2]._M_string_length;
              cmExpandedList_abi_cxx11_
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2f8,arg_01,false);
              uVar7 = local_2f8._8_8_;
              psVar1 = &pcVar19->LockedResources;
              local_428._0_8_ = psVar1;
              if (local_2f8._0_8_ != local_2f8._8_8_) {
                paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2f8._0_8_;
                do {
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::
                  _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)psVar1,
                             (const_iterator)
                             &(pcVar19->LockedResources)._M_t._M_impl.super__Rb_tree_header,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             paVar18,(_Alloc_node *)local_428);
                  paVar18 = paVar18 + 2;
                } while (paVar18 !=
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)uVar7);
              }
            }
            else {
              if ((sVar3 == 0x16) &&
                 (iVar12 = bcmp(__s1,"ATTACHED_FILES_ON_FAIL",0x16), iVar12 == 0)) {
                lVar14 = 0xa0;
                goto LAB_0017202f;
              }
LAB_001717b6:
              if ((sVar3 == 0xe) && (iVar12 = bcmp(__s1,"FIXTURES_SETUP",0xe), iVar12 == 0)) {
                arg_02._M_str = __x[2]._M_dataplus._M_p;
                arg_02._M_len = __x[2]._M_string_length;
                cmExpandedList_abi_cxx11_
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2f8,arg_02,false);
                uVar7 = local_2f8._8_8_;
                psVar1 = &pcVar19->FixturesSetup;
                local_428._0_8_ = psVar1;
                if (local_2f8._0_8_ != local_2f8._8_8_) {
                  paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_2f8._0_8_;
                  do {
                    std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::
                    _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)psVar1,
                               (const_iterator)
                               &(pcVar19->FixturesSetup)._M_t._M_impl.super__Rb_tree_header,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               paVar18,(_Alloc_node *)local_428);
                    paVar18 = paVar18 + 2;
                  } while (paVar18 !=
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)uVar7);
                }
              }
              else if ((sVar3 == 0x10) && (iVar12 = bcmp(__s1,"FIXTURES_CLEANUP",0x10), iVar12 == 0)
                      ) {
                arg_03._M_str = __x[2]._M_dataplus._M_p;
                arg_03._M_len = __x[2]._M_string_length;
                cmExpandedList_abi_cxx11_
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2f8,arg_03,false);
                uVar7 = local_2f8._8_8_;
                psVar1 = &pcVar19->FixturesCleanup;
                local_428._0_8_ = psVar1;
                if (local_2f8._0_8_ != local_2f8._8_8_) {
                  paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_2f8._0_8_;
                  do {
                    std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::
                    _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)psVar1,
                               (const_iterator)
                               &(pcVar19->FixturesCleanup)._M_t._M_impl.super__Rb_tree_header,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               paVar18,(_Alloc_node *)local_428);
                    paVar18 = paVar18 + 2;
                  } while (paVar18 !=
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)uVar7);
                }
              }
              else {
                if ((sVar3 != 0x11) || (iVar12 = bcmp(__s1,"FIXTURES_REQUIRED",0x11), iVar12 != 0))
                {
                  if ((sVar3 == 7) && (iVar12 = bcmp(__s1,"TIMEOUT",7), iVar12 == 0)) {
                    dVar5 = atof((val->_M_dataplus)._M_p);
                    (pcVar19->Timeout).__r = dVar5;
                    pcVar19->ExplicitTimeout = true;
                    goto LAB_0017234c;
                  }
                  if ((sVar3 == 4) && (iVar12 = bcmp(__s1,"COST",4), iVar12 == 0)) {
                    dVar5 = atof((val->_M_dataplus)._M_p);
                    pcVar19->Cost = (float)dVar5;
                  }
                  else {
                    if ((sVar3 == 0xe) && (iVar12 = bcmp(__s1,"REQUIRED_FILES",0xe), iVar12 == 0)) {
                      lVar14 = 0x58;
                      goto LAB_0017202f;
                    }
                    if ((sVar3 == 10) && (iVar12 = bcmp(__s1,"RUN_SERIAL",10), iVar12 == 0)) {
                      value_01._M_str = extraout_RDX_01;
                      value_01._M_len = (size_t)__x[2]._M_dataplus._M_p;
                      bVar21 = cmValue::IsOn((cmValue *)__x[2]._M_string_length,value_01);
                      pcVar19->RunSerial = bVar21;
                    }
                    else {
                      if (sVar3 == 0x17) {
                        iVar12 = bcmp(__s1,"FAIL_REGULAR_EXPRESSION",0x17);
                        if (iVar12 == 0) {
                          arg_05._M_str = __x[2]._M_dataplus._M_p;
                          arg_05._M_len = __x[2]._M_string_length;
                          cmExpandedList_abi_cxx11_
                                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_2f8,arg_05,false);
                          uVar7 = local_2f8._8_8_;
                          if (local_2f8._0_8_ != local_2f8._8_8_) {
                            paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_2f8._0_8_;
                            do {
                              std::
                              vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                              ::
                              emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                                        ((vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                                          *)&pcVar19->ErrorRegularExpressions,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)paVar18,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)paVar18);
                              paVar18 = paVar18 + 2;
                            } while (paVar18 !=
                                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                      *)uVar7);
                          }
                        }
                        else {
                          iVar12 = bcmp(__s1,"SKIP_REGULAR_EXPRESSION",0x17);
                          if (iVar12 != 0) goto LAB_001718d6;
                          arg_06._M_str = __x[2]._M_dataplus._M_p;
                          arg_06._M_len = __x[2]._M_string_length;
                          cmExpandedList_abi_cxx11_
                                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_2f8,arg_06,false);
                          uVar7 = local_2f8._8_8_;
                          if (local_2f8._0_8_ != local_2f8._8_8_) {
                            paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_2f8._0_8_;
                            do {
                              std::
                              vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                              ::
                              emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                                        ((vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                                          *)&pcVar19->SkipRegularExpressions,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)paVar18,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)paVar18);
                              paVar18 = paVar18 + 2;
                            } while (paVar18 !=
                                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                      *)uVar7);
                          }
                        }
                        goto LAB_0017233f;
                      }
LAB_001718d6:
                      if ((sVar3 == 10) && (iVar12 = bcmp(__s1,"PROCESSORS",10), iVar12 == 0)) {
                        iVar12 = atoi((val->_M_dataplus)._M_p);
                        if (iVar12 < 2) {
                          iVar12 = 1;
                        }
                        pcVar19->Processors = iVar12;
                      }
                      else if ((sVar3 == 0x12) &&
                              (iVar12 = bcmp(__s1,"PROCESSOR_AFFINITY",0x12), iVar12 == 0)) {
                        value_02._M_str = extraout_RDX_02;
                        value_02._M_len = (size_t)__x[2]._M_dataplus._M_p;
                        bVar21 = cmValue::IsOn((cmValue *)__x[2]._M_string_length,value_02);
                        pcVar19->WantAffinity = bVar21;
                      }
                      else if ((sVar3 == 0xf) &&
                              (iVar12 = bcmp(__s1,"RESOURCE_GROUPS",0xf), iVar12 == 0)) {
                        bVar11 = ParseResourceGroupsProperty(val,&pcVar19->ResourceGroups);
                        if (!bVar11) {
                          local_454 = 1;
                          goto LAB_00172460;
                        }
                      }
                      else {
                        if ((sVar3 != 0x10) ||
                           (iVar12 = bcmp(__s1,"SKIP_RETURN_CODE",0x10), iVar12 != 0)) {
                          if ((sVar3 == 7) && (iVar12 = bcmp(__s1,"DEPENDS",7), iVar12 == 0)) {
                            lVar14 = 0x70;
                          }
                          else {
                            if ((sVar3 != 0xb) ||
                               (iVar12 = bcmp(__s1,"ENVIRONMENT",0xb), iVar12 != 0)) {
                              if (sVar3 == 6) {
                                iVar12 = bcmp(__s1,"LABELS",6);
                                if (iVar12 == 0) {
                                  arg_07._M_str = __x[2]._M_dataplus._M_p;
                                  arg_07._M_len = __x[2]._M_string_length;
                                  cmExpandedList_abi_cxx11_
                                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)local_2f8,arg_07,false);
                                  std::
                                  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  ::
                                  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                              *)&pcVar19->Labels,
                                             (pcVar19->Labels).
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish,
                                             local_2f8._0_8_);
                                  std::
                                  sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                            ((pcVar19->Labels).
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start,
                                             (pcVar19->Labels).
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish);
                                  __first = std::
                                            __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                                                      ((pcVar19->Labels).
                                                                                                              
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (pcVar19->Labels).
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                                  std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::_M_erase(&pcVar19->Labels,(iterator)__first._M_current,
                                             (pcVar19->Labels).
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish);
                                  goto LAB_0017233f;
                                }
                              }
                              else if ((sVar3 == 0x18) &&
                                      (iVar12 = bcmp(__s1,"ENVIRONMENT_MODIFICATION",0x18),
                                      iVar12 == 0)) {
                                lVar14 = 0x1b8;
                                goto LAB_0017202f;
                              }
                              if ((sVar3 == 0xb) &&
                                 (iVar12 = bcmp(__s1,"MEASUREMENT",0xb), iVar12 == 0)) {
                                lVar14 = std::__cxx11::string::find((char)val,0x3d);
                                if (lVar14 == -1) {
                                  pmVar15 = std::
                                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            ::operator[](&pcVar19->Measurements,val);
                                  std::__cxx11::string::operator=((string *)pmVar15,"1");
                                }
                                else {
                                  std::__cxx11::string::substr((ulong)local_2f8,(ulong)val);
                                  std::__cxx11::string::substr((ulong)local_428,(ulong)val);
                                  pmVar15 = std::
                                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            ::operator[](&pcVar19->Measurements,
                                                         (key_type *)local_2f8);
                                  std::__cxx11::string::operator=
                                            ((string *)pmVar15,(string *)local_428);
                                  if ((element_type *)local_428._0_8_ !=
                                      (element_type *)(local_428 + 0x10)) {
                                    operator_delete((void *)local_428._0_8_,
                                                    CONCAT71(local_428._17_7_,local_428[0x10]) + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_2f8._0_8_ != local_2e8) {
                                    operator_delete((void *)local_2f8._0_8_,
                                                    (ulong)(local_2e8[0]._M_allocated_capacity + 1))
                                    ;
                                  }
                                }
                              }
                              else {
                                if ((sVar3 == 0x17) &&
                                   (iVar12 = bcmp(__s1,"PASS_REGULAR_EXPRESSION",0x17), iVar12 == 0)
                                   ) {
                                  arg_08._M_str = __x[2]._M_dataplus._M_p;
                                  arg_08._M_len = __x[2]._M_string_length;
                                  cmExpandedList_abi_cxx11_
                                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)local_2f8,arg_08,false);
                                  uVar7 = local_2f8._8_8_;
                                  if (local_2f8._0_8_ != local_2f8._8_8_) {
                                    paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_2f8._0_8_;
                                    do {
                                      std::
                                      vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                                      ::
                                      emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                                                ((vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                                                  *)&pcVar19->RequiredRegularExpressions,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)paVar18,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)paVar18);
                                      paVar18 = paVar18 + 2;
                                    } while (paVar18 !=
                                             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                              *)uVar7);
                                  }
                                  goto LAB_0017233f;
                                }
                                if ((sVar3 == 0x11) &&
                                   (iVar12 = bcmp(__s1,"WORKING_DIRECTORY",0x11), iVar12 == 0)) {
                                  std::__cxx11::string::_M_assign((string *)&pcVar19->Directory);
                                }
                                else if ((sVar3 == 0x13) &&
                                        (iVar12 = bcmp(__s1,"TIMEOUT_AFTER_MATCH",0x13), iVar12 == 0
                                        )) {
                                  arg._M_str = __x[2]._M_dataplus._M_p;
                                  arg._M_len = __x[2]._M_string_length;
                                  cmExpandedList_abi_cxx11_(&local_448,arg,false);
                                  pbVar6 = local_448.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                                  if ((long)local_448.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_448.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start == 0x40) {
                                    dVar5 = atof(((local_448.
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 _M_dataplus)._M_p);
                                    (pcVar19->AlternateTimeout).__r = dVar5;
                                    arg_00._M_str = pbVar6[1]._M_dataplus._M_p;
                                    arg_00._M_len = pbVar6[1]._M_string_length;
                                    cmExpandedList_abi_cxx11_
                                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)local_2f8,arg_00,false);
                                    uVar7 = local_2f8._8_8_;
                                    if (local_2f8._0_8_ != local_2f8._8_8_) {
                                      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_2f8._0_8_;
                                      do {
                                        std::
                                        vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                                        ::
                                        emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                                                  ((
                                                  vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                                                  *)&pcVar19->TimeoutRegularExpressions,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)paVar18,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)paVar18);
                                        paVar18 = paVar18 + 2;
                                      } while (paVar18 !=
                                               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                *)uVar7);
                                    }
                                    std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)local_2f8);
                                  }
                                  else {
                                    std::__cxx11::ostringstream::ostringstream
                                              ((ostringstream *)local_2f8);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_2f8,
                                               "TIMEOUT_AFTER_MATCH expects two arguments, found ",
                                               0x31);
                                    poVar16 = std::ostream::_M_insert<unsigned_long>
                                                        ((ulong)local_2f8);
                                    std::endl<char,std::char_traits<char>>(poVar16);
                                    this_00 = (local_3b0->super_cmCTestGenericHandler).CTest;
                                    std::__cxx11::stringbuf::str();
                                    cmCTest::Log(this_00,6,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                                                 ,0x912,(char *)local_428._0_8_,false);
                                    if ((element_type *)local_428._0_8_ !=
                                        (element_type *)(local_428 + 0x10)) {
                                      operator_delete((void *)local_428._0_8_,
                                                      CONCAT71(local_428._17_7_,local_428[0x10]) + 1
                                                     );
                                    }
                                    std::__cxx11::ostringstream::~ostringstream
                                              ((ostringstream *)local_2f8);
                                    std::ios_base::~ios_base(local_288);
                                  }
                                  goto LAB_00171dea;
                                }
                              }
                              goto LAB_0017234c;
                            }
                            lVar14 = 0x1a0;
                          }
                          goto LAB_0017202f;
                        }
                        uVar13 = atoi((val->_M_dataplus)._M_p);
                        if (0xff < uVar13) {
                          uVar13 = 0xffffffff;
                        }
                        pcVar19->SkipReturnCode = uVar13;
                      }
                    }
                  }
                  goto LAB_0017234c;
                }
                arg_04._M_str = __x[2]._M_dataplus._M_p;
                arg_04._M_len = __x[2]._M_string_length;
                cmExpandedList_abi_cxx11_
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2f8,arg_04,false);
                uVar7 = local_2f8._8_8_;
                psVar1 = &pcVar19->FixturesRequired;
                local_428._0_8_ = psVar1;
                if (local_2f8._0_8_ != local_2f8._8_8_) {
                  paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_2f8._0_8_;
                  do {
                    std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::
                    _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)psVar1,
                               (const_iterator)
                               &(pcVar19->FixturesRequired)._M_t._M_impl.super__Rb_tree_header,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               paVar18,(_Alloc_node *)local_428);
                    paVar18 = paVar18 + 2;
                  } while (paVar18 !=
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)uVar7);
                }
              }
            }
LAB_0017233f:
            this_01 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_2f8;
            goto LAB_00172347;
          }
          lVar14 = 0x88;
LAB_0017202f:
          arg_10._M_str = __x[2]._M_dataplus._M_p;
          arg_10._M_len = __x[2]._M_string_length;
          cmExpandList(arg_10,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)((long)&(pcVar19->Name)._M_dataplus._M_p + lVar14),false);
        }
LAB_0017234c:
        pcVar19 = pcVar19 + 1;
        bVar21 = pcVar19 == local_370;
        goto LAB_001716ad;
      }
LAB_00172477:
      local_454 = 8;
LAB_0017247f:
      if (local_454 == 8) {
        local_454 = 0;
      }
    }
    __x = val;
  } while (local_454 == 0);
  bVar21 = true;
  if (local_454 == 5) goto LAB_001724ae;
LAB_001724ac:
  bVar21 = false;
LAB_001724ae:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3a8);
  return bVar21;
}

Assistant:

bool cmCTestTestHandler::SetTestsProperties(
  const std::vector<std::string>& args)
{
  std::vector<std::string>::const_iterator it;
  std::vector<std::string> tests;
  bool found = false;
  for (it = args.begin(); it != args.end(); ++it) {
    if (*it == "PROPERTIES") {
      found = true;
      break;
    }
    tests.push_back(*it);
  }
  if (!found) {
    return false;
  }
  ++it; // skip PROPERTIES
  for (; it != args.end(); ++it) {
    std::string const& key = *it;
    ++it;
    if (it == args.end()) {
      break;
    }
    std::string const& val = *it;
    for (std::string const& t : tests) {
      for (cmCTestTestProperties& rt : this->TestList) {
        if (t == rt.Name) {
          if (key == "_BACKTRACE_TRIPLES"_s) {
            std::vector<std::string> triples;
            // allow empty args in the triples
            cmExpandList(val, triples, true);

            // Ensure we have complete triples otherwise the data is corrupt.
            if (triples.size() % 3 == 0) {
              cmState state(cmState::Unknown);
              rt.Backtrace = cmListFileBacktrace();

              // the first entry represents the top of the trace so we need to
              // reconstruct the backtrace in reverse
              for (size_t i = triples.size(); i >= 3; i -= 3) {
                cmListFileContext fc;
                fc.FilePath = triples[i - 3];
                long line = 0;
                if (!cmStrToLong(triples[i - 2], &line)) {
                  line = 0;
                }
                fc.Line = line;
                fc.Name = triples[i - 1];
                rt.Backtrace = rt.Backtrace.Push(fc);
              }
            }
          } else if (key == "WILL_FAIL"_s) {
            rt.WillFail = cmIsOn(val);
          } else if (key == "DISABLED"_s) {
            rt.Disabled = cmIsOn(val);
          } else if (key == "ATTACHED_FILES"_s) {
            cmExpandList(val, rt.AttachedFiles);
          } else if (key == "ATTACHED_FILES_ON_FAIL"_s) {
            cmExpandList(val, rt.AttachOnFail);
          } else if (key == "RESOURCE_LOCK"_s) {
            std::vector<std::string> lval = cmExpandedList(val);

            rt.LockedResources.insert(lval.begin(), lval.end());
          } else if (key == "FIXTURES_SETUP"_s) {
            std::vector<std::string> lval = cmExpandedList(val);

            rt.FixturesSetup.insert(lval.begin(), lval.end());
          } else if (key == "FIXTURES_CLEANUP"_s) {
            std::vector<std::string> lval = cmExpandedList(val);

            rt.FixturesCleanup.insert(lval.begin(), lval.end());
          } else if (key == "FIXTURES_REQUIRED"_s) {
            std::vector<std::string> lval = cmExpandedList(val);

            rt.FixturesRequired.insert(lval.begin(), lval.end());
          } else if (key == "TIMEOUT"_s) {
            rt.Timeout = cmDuration(atof(val.c_str()));
            rt.ExplicitTimeout = true;
          } else if (key == "COST"_s) {
            rt.Cost = static_cast<float>(atof(val.c_str()));
          } else if (key == "REQUIRED_FILES"_s) {
            cmExpandList(val, rt.RequiredFiles);
          } else if (key == "RUN_SERIAL"_s) {
            rt.RunSerial = cmIsOn(val);
          } else if (key == "FAIL_REGULAR_EXPRESSION"_s) {
            std::vector<std::string> lval = cmExpandedList(val);
            for (std::string const& cr : lval) {
              rt.ErrorRegularExpressions.emplace_back(cr, cr);
            }
          } else if (key == "SKIP_REGULAR_EXPRESSION"_s) {
            std::vector<std::string> lval = cmExpandedList(val);
            for (std::string const& cr : lval) {
              rt.SkipRegularExpressions.emplace_back(cr, cr);
            }
          } else if (key == "PROCESSORS"_s) {
            rt.Processors = atoi(val.c_str());
            if (rt.Processors < 1) {
              rt.Processors = 1;
            }
          } else if (key == "PROCESSOR_AFFINITY"_s) {
            rt.WantAffinity = cmIsOn(val);
          } else if (key == "RESOURCE_GROUPS"_s) {
            if (!ParseResourceGroupsProperty(val, rt.ResourceGroups)) {
              return false;
            }
          } else if (key == "SKIP_RETURN_CODE"_s) {
            rt.SkipReturnCode = atoi(val.c_str());
            if (rt.SkipReturnCode < 0 || rt.SkipReturnCode > 255) {
              rt.SkipReturnCode = -1;
            }
          } else if (key == "DEPENDS"_s) {
            cmExpandList(val, rt.Depends);
          } else if (key == "ENVIRONMENT"_s) {
            cmExpandList(val, rt.Environment);
          } else if (key == "ENVIRONMENT_MODIFICATION"_s) {
            cmExpandList(val, rt.EnvironmentModification);
          } else if (key == "LABELS"_s) {
            std::vector<std::string> Labels = cmExpandedList(val);
            rt.Labels.insert(rt.Labels.end(), Labels.begin(), Labels.end());
            // sort the array
            std::sort(rt.Labels.begin(), rt.Labels.end());
            // remove duplicates
            auto new_end = std::unique(rt.Labels.begin(), rt.Labels.end());
            rt.Labels.erase(new_end, rt.Labels.end());
          } else if (key == "MEASUREMENT"_s) {
            size_t pos = val.find_first_of('=');
            if (pos != std::string::npos) {
              std::string mKey = val.substr(0, pos);
              std::string mVal = val.substr(pos + 1);
              rt.Measurements[mKey] = std::move(mVal);
            } else {
              rt.Measurements[val] = "1";
            }
          } else if (key == "PASS_REGULAR_EXPRESSION"_s) {
            std::vector<std::string> lval = cmExpandedList(val);
            for (std::string const& cr : lval) {
              rt.RequiredRegularExpressions.emplace_back(cr, cr);
            }
          } else if (key == "WORKING_DIRECTORY"_s) {
            rt.Directory = val;
          } else if (key == "TIMEOUT_AFTER_MATCH"_s) {
            std::vector<std::string> propArgs = cmExpandedList(val);
            if (propArgs.size() != 2) {
              cmCTestLog(this->CTest, WARNING,
                         "TIMEOUT_AFTER_MATCH expects two arguments, found "
                           << propArgs.size() << std::endl);
            } else {
              rt.AlternateTimeout = cmDuration(atof(propArgs[0].c_str()));
              std::vector<std::string> lval = cmExpandedList(propArgs[1]);
              for (std::string const& cr : lval) {
                rt.TimeoutRegularExpressions.emplace_back(cr, cr);
              }
            }
          }
        }
      }
    }
  }
  return true;
}